

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcExpand.c
# Opt level: O0

void Abc_NtkExpandCubes(Abc_Ntk_t *pNtk,Gia_Man_t *pGia,int fVerbose)

{
  Mem_Flex_t *pMan;
  Abc_Obj_t *p;
  int iVar1;
  int iVar2;
  Vec_Str_t *p_00;
  char *pcVar3;
  Vec_Str_t *vSop;
  Abc_Obj_t *pAStack_30;
  int i;
  Abc_Obj_t *pObj;
  Gia_Man_t *pNew;
  Gia_Man_t *pGStack_18;
  int fVerbose_local;
  Gia_Man_t *pGia_local;
  Abc_Ntk_t *pNtk_local;
  
  pNew._4_4_ = fVerbose;
  pGStack_18 = pGia;
  pGia_local = (Gia_Man_t *)pNtk;
  p_00 = Vec_StrAlloc(1000);
  iVar1 = Abc_NtkIsSopLogic((Abc_Ntk_t *)pGia_local);
  if (iVar1 == 0) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                  ,0x8c,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  iVar1 = Abc_NtkCiNum((Abc_Ntk_t *)pGia_local);
  iVar2 = Gia_ManCiNum(pGStack_18);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkCiNum(pNtk) == Gia_ManCiNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                  ,0x8d,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)pGia_local);
  iVar2 = Gia_ManCoNum(pGStack_18);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkCoNum(pNtk) == Gia_ManCoNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                  ,0x8e,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
  }
  vSop._4_4_ = 0;
  do {
    iVar1 = vSop._4_4_;
    iVar2 = Abc_NtkCoNum((Abc_Ntk_t *)pGia_local);
    if (iVar2 <= iVar1) {
      Vec_StrFree(p_00);
      Abc_NtkSortSops((Abc_Ntk_t *)pGia_local);
      return;
    }
    pAStack_30 = Abc_NtkCo((Abc_Ntk_t *)pGia_local,vSop._4_4_);
    pAStack_30 = Abc_ObjFanin0(pAStack_30);
    iVar1 = Abc_ObjIsNode(pAStack_30);
    if ((iVar1 != 0) && (iVar1 = Abc_ObjFaninNum(pAStack_30), iVar1 != 0)) {
      iVar1 = Abc_ObjFaninNum(pAStack_30);
      iVar2 = Gia_ManCiNum(pGStack_18);
      if (iVar1 != iVar2) {
        __assert_fail("Abc_ObjFaninNum(pObj) == Gia_ManCiNum(pGia)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                      ,0x94,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
      }
      Vec_StrClear(p_00);
      Vec_StrAppend(p_00,(char *)(pAStack_30->field_5).pData);
      Vec_StrPush(p_00,'\0');
      pObj = (Abc_Obj_t *)Gia_ManDupCones(pGStack_18,(int *)((long)&vSop + 4),1,0);
      iVar1 = Gia_ManCiNum((Gia_Man_t *)pObj);
      iVar2 = Gia_ManCiNum(pGStack_18);
      p = pObj;
      if (iVar1 != iVar2) {
        __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(pGia)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcExpand.c"
                      ,0x9b,"void Abc_NtkExpandCubes(Abc_Ntk_t *, Gia_Man_t *, int)");
      }
      iVar1 = Abc_ObjFaninNum(pAStack_30);
      iVar1 = Abc_ObjExpandCubes(p_00,(Gia_Man_t *)p,iVar1);
      if (iVar1 != 0) {
        Vec_IntClear(&pAStack_30->vFanins);
      }
      Gia_ManStop((Gia_Man_t *)pObj);
      pMan = (Mem_Flex_t *)pGia_local->vFanout;
      pcVar3 = Vec_StrArray(p_00);
      pcVar3 = Abc_SopRegister(pMan,pcVar3);
      (pAStack_30->field_5).pData = pcVar3;
    }
    vSop._4_4_ = vSop._4_4_ + 1;
  } while( true );
}

Assistant:

void Abc_NtkExpandCubes( Abc_Ntk_t * pNtk, Gia_Man_t * pGia, int fVerbose )
{
    Gia_Man_t * pNew;
    Abc_Obj_t * pObj; int i;
    Vec_Str_t * vSop = Vec_StrAlloc( 1000 );
    assert( Abc_NtkIsSopLogic(pNtk) );
    assert( Abc_NtkCiNum(pNtk) == Gia_ManCiNum(pGia) );
    assert( Abc_NtkCoNum(pNtk) == Gia_ManCoNum(pGia) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pObj = Abc_ObjFanin0(pObj);
        if ( !Abc_ObjIsNode(pObj) || Abc_ObjFaninNum(pObj) == 0 )
            continue;
        assert( Abc_ObjFaninNum(pObj) == Gia_ManCiNum(pGia) );

        Vec_StrClear( vSop );
        Vec_StrAppend( vSop, (char *)pObj->pData );
        Vec_StrPush( vSop, '\0' );

        pNew = Gia_ManDupCones( pGia, &i, 1, 0 );
        assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(pGia) );
        if ( Abc_ObjExpandCubes( vSop, pNew, Abc_ObjFaninNum(pObj) ) )
            Vec_IntClear( &pObj->vFanins );
        Gia_ManStop( pNew );

        pObj->pData = Abc_SopRegister( (Mem_Flex_t *)pNtk->pManFunc, Vec_StrArray(vSop) );
    }
    Vec_StrFree( vSop );
    Abc_NtkSortSops( pNtk );
}